

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImChunkStream<ImGuiWindowSettings>::clear(ImChunkStream<ImGuiWindowSettings> *this)

{
  ImChunkStream<ImGuiWindowSettings> *this_local;
  
  ImVector<char>::clear(&this->Buf);
  return;
}

Assistant:

void    clear()                     { Buf.clear(); }